

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProxy::~IfcProxy(IfcProxy *this,void **vtt)

{
  void *pvVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0x19];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcProduct).field_0x100 = vtt[0x1d];
  pcVar2 = (this->Tag).ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->Tag).ptr.field_2) {
    operator_delete(pcVar2);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcProduct).field_0x110;
  if (puVar3 != &this->field_0x120) {
    operator_delete(puVar3);
  }
  pvVar1 = vtt[2];
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0xe];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0xf];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x10];
  puVar3 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (puVar3 != &(this->super_IfcProduct).super_IfcObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20) {
    operator_delete(puVar3);
  }
  pvVar1 = vtt[4];
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[7];
  puVar3 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  if (puVar3 != &(this->super_IfcProduct).super_IfcObject.field_0x70) {
    operator_delete(puVar3);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  if (puVar3 != &(this->super_IfcProduct).super_IfcObject.field_0x48) {
    operator_delete(puVar3);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  if (puVar3 != &(this->super_IfcProduct).super_IfcObject.field_0x20) {
    operator_delete(puVar3);
    return;
  }
  return;
}

Assistant:

IfcProxy() : Object("IfcProxy") {}